

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FoldingSet.cpp
# Opt level: O0

void __thiscall llvm::FoldingSetBase::GrowBucketCount(FoldingSetBase *this,uint NewBucketCount)

{
  void **__ptr;
  bool bVar1;
  uint Hash;
  void **ppvVar2;
  Node *this_00;
  Node *NodeInBucket;
  void *Probe;
  undefined1 local_b8 [4];
  uint i;
  FoldingSetNodeID TempID;
  uint OldNumBuckets;
  void **OldBuckets;
  uint NewBucketCount_local;
  FoldingSetBase *this_local;
  
  if (NewBucketCount <= this->NumBuckets) {
    __assert_fail("(NewBucketCount > NumBuckets) && \"Can\'t shrink a folding set with GrowBucketCount\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/FoldingSet.cpp"
                  ,0x10f,"void llvm::FoldingSetBase::GrowBucketCount(unsigned int)");
  }
  bVar1 = isPowerOf2_32(NewBucketCount);
  if (bVar1) {
    __ptr = this->Buckets;
    TempID.Bits.super_SmallVectorStorage<unsigned_int,_32U>.InlineElts[0x1f].
    super_AlignedCharArray<4UL,_4UL>.buffer = (AlignedCharArray<4UL,_4UL>)this->NumBuckets;
    ppvVar2 = AllocateBuckets(NewBucketCount);
    this->Buckets = ppvVar2;
    this->NumBuckets = NewBucketCount;
    this->NumNodes = 0;
    FoldingSetNodeID::FoldingSetNodeID((FoldingSetNodeID *)local_b8);
    Probe._4_1_ = '\0';
    Probe._5_1_ = '\0';
    Probe._6_1_ = '\0';
    Probe._7_1_ = '\0';
    for (; (AlignedCharArray<4UL,_4UL>)Probe._4_4_ !=
           TempID.Bits.super_SmallVectorStorage<unsigned_int,_32U>.InlineElts[0x1f].
           super_AlignedCharArray<4UL,_4UL>.buffer; Probe._4_4_ = Probe._4_4_ + 1) {
      NodeInBucket = (Node *)__ptr[(uint)Probe._4_4_];
      if (NodeInBucket != (Node *)0x0) {
        while (this_00 = GetNextPtr(NodeInBucket), this_00 != (Node *)0x0) {
          NodeInBucket = (Node *)Node::getNextInBucket(this_00);
          Node::SetNextInBucket(this_00,(void *)0x0);
          Hash = (*this->_vptr_FoldingSetBase[3])(this,this_00,local_b8);
          ppvVar2 = GetBucketFor(Hash,this->Buckets,this->NumBuckets);
          InsertNode(this,this_00,ppvVar2);
          FoldingSetNodeID::clear((FoldingSetNodeID *)local_b8);
        }
      }
    }
    free(__ptr);
    FoldingSetNodeID::~FoldingSetNodeID((FoldingSetNodeID *)local_b8);
    return;
  }
  __assert_fail("isPowerOf2_32(NewBucketCount) && \"Bad bucket count!\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/FoldingSet.cpp"
                ,0x110,"void llvm::FoldingSetBase::GrowBucketCount(unsigned int)");
}

Assistant:

void FoldingSetBase::GrowBucketCount(unsigned NewBucketCount) {
  assert((NewBucketCount > NumBuckets) && "Can't shrink a folding set with GrowBucketCount");
  assert(isPowerOf2_32(NewBucketCount) && "Bad bucket count!");
  void **OldBuckets = Buckets;
  unsigned OldNumBuckets = NumBuckets;

  // Clear out new buckets.
  Buckets = AllocateBuckets(NewBucketCount);
  // Set NumBuckets only if allocation of new buckets was successful.
  NumBuckets = NewBucketCount;
  NumNodes = 0;

  // Walk the old buckets, rehashing nodes into their new place.
  FoldingSetNodeID TempID;
  for (unsigned i = 0; i != OldNumBuckets; ++i) {
    void *Probe = OldBuckets[i];
    if (!Probe) continue;
    while (Node *NodeInBucket = GetNextPtr(Probe)) {
      // Figure out the next link, remove NodeInBucket from the old link.
      Probe = NodeInBucket->getNextInBucket();
      NodeInBucket->SetNextInBucket(nullptr);

      // Insert the node into the new bucket, after recomputing the hash.
      InsertNode(NodeInBucket,
                 GetBucketFor(ComputeNodeHash(NodeInBucket, TempID),
                              Buckets, NumBuckets));
      TempID.clear();
    }
  }

  free(OldBuckets);
}